

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_status_t linear_hash_delete(ion_byte_t *key,linear_hash_table_t *linear_hash)

{
  int iVar1;
  ion_key_size_t iVar2;
  FILE *pFVar3;
  ion_dictionary_compare_t p_Var4;
  ion_byte_t *piVar5;
  ion_byte_t *piVar6;
  long lVar7;
  void *__dest;
  undefined8 bucket_loc;
  long record_loc;
  char cVar8;
  int iVar9;
  void *__dest_00;
  ion_byte_t *piVar10;
  ion_byte_t *value;
  size_t sVar11;
  void *pvVar12;
  void *__s;
  ulong uVar13;
  ion_fpos_t bucket_loc_00;
  ulong uVar14;
  linear_hash_table_t *linear_hash_00;
  ulong uVar15;
  long lVar16;
  ion_byte_t aiStack_c0 [8];
  undefined8 local_b8;
  ion_byte_t *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [8];
  linear_hash_bucket_t bucket;
  long local_58;
  ion_fpos_t swap_record_loc;
  long local_48;
  linear_hash_table_t *local_40;
  int local_38;
  ion_byte_t local_32;
  byte local_31;
  ion_byte_t terminal_record_status;
  
  builtin_memcpy(aiStack_c0,"h\x05\x11",4);
  aiStack_c0[4] = '\0';
  aiStack_c0[5] = '\0';
  aiStack_c0[6] = '\0';
  aiStack_c0[7] = '\0';
  iVar9 = insert_hash_to_bucket(key,linear_hash);
  if (iVar9 < linear_hash->next_split) {
    builtin_memcpy(aiStack_c0,"|\x05\x11",4);
    aiStack_c0[4] = '\0';
    aiStack_c0[5] = '\0';
    aiStack_c0[6] = '\0';
    aiStack_c0[7] = '\0';
    iVar9 = hash_to_bucket(key,linear_hash);
  }
  bucket_loc_00 = -1;
  if (iVar9 < linear_hash->bucket_map->current_size) {
    bucket_loc_00 = linear_hash->bucket_map->data[iVar9];
  }
  aiStack_c0[0] = 0xac;
  aiStack_c0[1] = '\x05';
  aiStack_c0[2] = '\x11';
  aiStack_c0[3] = '\0';
  aiStack_c0[4] = '\0';
  aiStack_c0[5] = '\0';
  aiStack_c0[6] = '\0';
  aiStack_c0[7] = '\0';
  local_31 = linear_hash_get_bucket(bucket_loc_00,(linear_hash_bucket_t *)local_a0,linear_hash);
  uVar13 = 0;
  if (local_31 == 0) {
    uVar14 = (long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0;
    pvVar12 = (void *)((long)&local_b8 - uVar14);
    uVar15 = (long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0;
    __dest_00 = (void *)((long)pvVar12 - uVar15);
    sVar11 = (long)linear_hash->records_per_bucket * linear_hash->record_total_size;
    __s = (void *)((long)__dest_00 - (sVar11 + 0xf & 0xfffffffffffffff0));
    swap_record_loc._4_4_ = iVar9;
    local_40 = linear_hash;
    *(undefined8 *)((long)__s + -8) = 0x110625;
    memset(__s,0,sVar11);
    piVar10 = (ion_byte_t *)((long)__s - uVar14);
    lVar7 = -uVar15;
    value = piVar10 + lVar7;
    local_32 = '\0';
    local_40->last_cache_idx = 0;
    local_a8 = 0;
    lVar16 = 0;
    linear_hash_00 = local_40;
    local_b8 = pvVar12;
    local_b0 = piVar10;
    do {
      pFVar3 = (FILE *)linear_hash_00->database;
      local_48 = bucket_loc_00 + 0x10;
      builtin_memcpy(piVar10 + lVar7 + -8,"\x7f\x06\x11",4);
      value[-4] = '\0';
      value[-3] = '\0';
      value[-2] = '\0';
      value[-1] = '\0';
      fseek(pFVar3,bucket_loc_00 + 0x10,0);
      iVar9 = linear_hash_00->records_per_bucket;
      sVar11 = linear_hash_00->record_total_size;
      pFVar3 = (FILE *)linear_hash_00->database;
      value[-8] = 0x94;
      value[-7] = '\x06';
      value[-6] = '\x11';
      value[-5] = '\0';
      value[-4] = '\0';
      value[-3] = '\0';
      value[-2] = '\0';
      value[-1] = '\0';
      sVar11 = fread(__s,sVar11,(long)iVar9,pFVar3);
      if (0 < (int)local_a0._4_4_) {
        iVar9 = 0;
        do {
          __dest = local_b8;
          pvVar12 = (void *)((long)__s + lVar16 + 1);
          iVar1 = (linear_hash_00->super).record.key_size;
          cVar8 = *(char *)((long)pvVar12 + -1);
          bucket.overflow_location = uVar13;
          local_38 = iVar9;
          value[-8] = 0xdb;
          value[-7] = '\x06';
          value[-6] = '\x11';
          value[-5] = '\0';
          value[-4] = '\0';
          value[-3] = '\0';
          value[-2] = '\0';
          value[-1] = '\0';
          memcpy(__dest,pvVar12,(long)iVar1);
          linear_hash_00 = local_40;
          iVar9 = (local_40->super).record.value_size;
          value[-8] = 0xf3;
          value[-7] = '\x06';
          value[-6] = '\x11';
          value[-5] = '\0';
          value[-4] = '\0';
          value[-3] = '\0';
          value[-2] = '\0';
          value[-1] = '\0';
          memcpy(__dest_00,(void *)((long)__s + iVar1 + lVar16 + 1),(long)iVar9);
          uVar13 = bucket.overflow_location;
          if (cVar8 != '\0') {
            p_Var4 = (linear_hash_00->super).compare;
            builtin_memcpy(piVar10 + lVar7 + -8,"\r\a\x11",4);
            value[-4] = '\0';
            value[-3] = '\0';
            value[-2] = '\0';
            value[-1] = '\0';
            cVar8 = (*p_Var4)(__dest,key,iVar1);
            uVar13 = bucket.overflow_location;
            if (cVar8 == '\0') {
              iVar9 = linear_hash_00->last_cache_idx;
              sVar11 = (size_t)(linear_hash_00->super).record.value_size;
              piVar5 = linear_hash_00->cache;
              builtin_memcpy(piVar10 + lVar7 + -8,"5\a\x11",4);
              value[-4] = '\0';
              value[-3] = '\0';
              value[-2] = '\0';
              value[-1] = '\0';
              memcpy(piVar5 + (long)iVar9 * sVar11,__dest_00,sVar11);
              iVar9 = swap_record_loc._4_4_;
              piVar5 = local_b0;
              linear_hash_00->last_cache_idx = linear_hash_00->last_cache_idx + 1;
              local_58 = local_48;
              builtin_memcpy(piVar10 + lVar7 + -8,"b\a\x11",4);
              value[-4] = '\0';
              value[-3] = '\0';
              value[-2] = '\0';
              value[-1] = '\0';
              linear_hash_get_bucket_swap_record
                        (iVar9,&local_58,piVar5,value,&local_32,linear_hash_00);
              while( true ) {
                iVar2 = (linear_hash_00->super).record.key_size;
                p_Var4 = (linear_hash_00->super).compare;
                builtin_memcpy(piVar10 + lVar7 + -8,"p\a\x11",4);
                value[-4] = '\0';
                value[-3] = '\0';
                value[-2] = '\0';
                value[-1] = '\0';
                cVar8 = (*p_Var4)(piVar5,key,iVar2);
                if (cVar8 != '\0') break;
                iVar9 = linear_hash_00->last_cache_idx;
                sVar11 = (size_t)(linear_hash_00->super).record.value_size;
                piVar6 = linear_hash_00->cache;
                value[-8] = 0x90;
                value[-7] = '\a';
                value[-6] = '\x11';
                value[-5] = '\0';
                value[-4] = '\0';
                value[-3] = '\0';
                value[-2] = '\0';
                value[-1] = '\0';
                memcpy(piVar6 + (long)iVar9 * sVar11,value,sVar11);
                iVar9 = swap_record_loc._4_4_;
                linear_hash_00->last_cache_idx = linear_hash_00->last_cache_idx + 1;
                if (local_48 == local_58) break;
                value[-8] = 0xb7;
                value[-7] = '\a';
                value[-6] = '\x11';
                value[-5] = '\0';
                value[-4] = '\0';
                value[-3] = '\0';
                value[-2] = '\0';
                value[-1] = '\0';
                linear_hash_get_bucket_swap_record
                          (iVar9,&local_58,piVar5,value,&local_32,linear_hash_00);
                if (local_32 == '\0') break;
                uVar13 = (ulong)((int)uVar13 + 1);
              }
              record_loc = local_48;
              if (local_48 != local_58) {
                value[-8] = 0xf0;
                value[-7] = '\a';
                value[-6] = '\x11';
                value[-5] = '\0';
                value[-4] = '\0';
                value[-3] = '\0';
                value[-2] = '\0';
                value[-1] = '\0';
                linear_hash_write_record(record_loc,piVar5,value,&local_32,linear_hash_00);
              }
              uVar13 = (ulong)((int)uVar13 + 1);
              if (local_31 != 0) goto LAB_00110873;
              builtin_memcpy(piVar10 + lVar7 + -8,"\x10\b\x11",4);
              value[-4] = '\0';
              value[-3] = '\0';
              value[-2] = '\0';
              value[-1] = '\0';
              linear_hash_get_bucket(bucket_loc_00,(linear_hash_bucket_t *)local_a0,linear_hash_00);
            }
          }
          sVar11 = linear_hash_00->record_total_size;
          local_48 = local_48 + sVar11;
          lVar16 = lVar16 + sVar11;
          iVar9 = local_38 + 1;
        } while (iVar9 < (int)local_a0._4_4_);
      }
      bucket_loc = bucket._0_8_;
      if (bucket._0_8_ == -1) {
        local_a8 = CONCAT71((int7)(sVar11 >> 8),1);
      }
      else {
        builtin_memcpy(piVar10 + lVar7 + -8,"K\b\x11",4);
        value[-4] = '\0';
        value[-3] = '\0';
        value[-2] = '\0';
        value[-1] = '\0';
        local_31 = linear_hash_get_bucket
                             (bucket_loc,(linear_hash_bucket_t *)local_a0,linear_hash_00);
        if (local_31 != 0) goto LAB_00110873;
        lVar16 = 0;
        bucket_loc_00 = bucket_loc;
      }
    } while ((char)local_a8 == '\0');
    local_31 = (int)uVar13 == 0;
LAB_00110873:
    uVar13 = uVar13 << 0x20;
  }
  return (ion_status_t)(local_31 | uVar13);
}

Assistant:

ion_status_t
linear_hash_delete(
	ion_byte_t			*key,
	linear_hash_table_t *linear_hash
) {
	/* status for result count */
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int i;

	ion_byte_t *records = alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t	record_offset = 0;
	ion_fpos_t	record_loc;

	/* memory allocated to transfer the terminal records to delete location for swap on delete */
	ion_byte_t	*terminal_record_key	= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*terminal_record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	terminal_record_status	= linear_hash_record_status_empty;

	linear_hash->last_cache_idx = 0;

	ion_boolean_t terminal = boolean_false;

	while (terminal == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);
		fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
		fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

		for (i = 0; i < bucket.record_count; i++) {
			/* read in record */
			memcpy(&record_status, records + record_offset, sizeof(record_status));
			memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
			memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

			if (record_status != 0) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					/* TODO Create wrapper methods and implement proper error propagation */
					/* cache the record being deleted's value */
					memcpy(linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, record_value, linear_hash->super.record.value_size);
					linear_hash->last_cache_idx++;

					/* store the record_loc in a write back paramter that is used before being overwritten */
					ion_fpos_t swap_record_loc = record_loc;

					/* obtain the swap record */
					linear_hash_get_bucket_swap_record(bucket_idx, &swap_record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);

					/* delete all swap records which are going to be deleted anyways */
					while (linear_hash->super.compare(terminal_record_key, key, linear_hash->super.record.key_size) == 0) {
						memcpy(linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, terminal_record_value, linear_hash->super.record.value_size);
						linear_hash->last_cache_idx++;

						/* if we are not trying to swap a record with itself */
						if (record_loc == swap_record_loc) {
							/* write the swapped record to record_loc */
							break;
						}

						linear_hash_get_bucket_swap_record(bucket_idx, &swap_record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);

						if (terminal_record_status == linear_hash_record_status_empty) {
							break;
						}

						status.count++;
					}

					/* if we are not trying to swap a record with itself */
					if (record_loc != swap_record_loc) {
						/* write the swapped record to record_loc */
						linear_hash_write_record(record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);
					}

					status.count++;

					if (status.error != err_ok) {
						return status;
					}

					linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);
				}
			}

			record_loc		+= linear_hash->record_total_size;
			record_offset	+= linear_hash->record_total_size;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			record_offset	= 0;
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status;
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
	}
	else {
		status.error = err_ok;
	}

	return status;
}